

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::util_getCoeff(HModel *this,int row,int col,double *val)

{
  int iVar1;
  pointer piVar2;
  ostream *poVar3;
  ulong uVar4;
  int iVar5;
  double dVar6;
  
  printf("Called model.util_getCoeff(row=%d, col=%d)\n");
  std::ostream::flush();
  poVar3 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  piVar2 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar2[col];
  uVar4 = (ulong)iVar1;
  iVar5 = piVar2[(long)col + 1];
  dVar6 = 0.0;
  if (iVar1 < iVar5) {
    iVar5 = iVar5 - iVar1;
    do {
      if ((this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] == row) {
        if (-1 < (long)uVar4) {
          dVar6 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar4 & 0xffffffff];
        }
        break;
      }
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  *val = dVar6;
  return;
}

Assistant:

void HModel::util_getCoeff(int row, int col, double* val) {
  assert(row >= 0 && row < numRow);
  assert(col >= 0 && col < numCol);
#ifdef JAJH_dev
  printf("Called model.util_getCoeff(row=%d, col=%d)\n", row, col);cout << flush;
#endif
  //  printf("Called model.util_getCoeff(row=%d, col=%d)\n", row, col);cout << flush;

  cout << val << endl;


  int get_el = -1;
  for (int el=Astart[col]; el < Astart[col+1]; el++) {
    //  printf("Column %4d: Element %4d is row %4d. Is it %4d?\n", col, el, Aindex[el], row);cout << flush;
  if (Aindex[el] == row) {
  get_el = el;
  break;
}
}
  if (get_el < 0) {
    //  printf("model.util_getCoeff: Cannot find row %d in column %d\n", row, col);cout << flush;
  *val = 0;
} else { 
    //  printf("model.util_getCoeff: Found row %d in column %d as element %d: value %g\n", row, col, get_el, Avalue[get_el]);cout << flush;
  *val = Avalue[get_el];
}
}